

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O1

void pdf_array_push_drop(hd_context *ctx,pdf_obj *obj,pdf_obj *item)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  
  if (((pdf_obj *)0x188 < obj) && (obj->kind == 'r')) {
    obj = pdf_resolve_indirect_chain(ctx,obj);
  }
  if ((pdf_obj *)0x188 < obj) {
    iVar2 = hd_push_try(ctx);
    if ((iVar2 != 0) && (iVar2 = __sigsetjmp(ctx->error->top->buffer,0), iVar2 == 0)) {
      pdf_array_push(ctx,obj,item);
    }
    phVar1 = ctx->error->top;
    iVar2 = phVar1->code;
    if (iVar2 < 3) {
      phVar1->code = iVar2 + 1;
      pdf_drop_obj(ctx,item);
    }
    phVar1 = ctx->error->top;
    ctx->error->top = phVar1 + -1;
    if (1 < phVar1->code) {
      hd_rethrow(ctx);
    }
  }
  return;
}

Assistant:

void
pdf_array_push_drop(hd_context *ctx, pdf_obj *obj, pdf_obj *item)
{
    RESOLVE(obj);
    if (obj >= PDF_OBJ__LIMIT)
    {
        hd_try(ctx)
            pdf_array_push(ctx, obj, item);
        hd_always(ctx)
            pdf_drop_obj(ctx, item);
        hd_catch(ctx)
            hd_rethrow(ctx);
    }
}